

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedNumberFormat::stripWhitespace
          (RuleBasedNumberFormat *this,UnicodeString *description)

{
  short sVar1;
  UBool UVar2;
  uint uVar3;
  int32_t iVar4;
  uint uVar5;
  int iVar6;
  char16_t *pcVar7;
  uint srcStart;
  uint c;
  long lVar8;
  UnicodeString result;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e6fd8;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  srcStart = 0;
  do {
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (description->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    if (iVar6 <= (int)srcStart) break;
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    uVar3 = (uint)sVar1;
    if (sVar1 < 0) {
      uVar5 = (description->fUnion).fFields.fLength;
    }
    else {
      uVar5 = (int)uVar3 >> 5;
    }
    if ((int)srcStart < (int)uVar5) {
      lVar8 = (long)(int)srcStart;
      do {
        c = 0xffff;
        if (srcStart < uVar5) {
          pcVar7 = (char16_t *)((long)&description->fUnion + 2);
          if ((uVar3 & 2) == 0) {
            pcVar7 = (description->fUnion).fFields.fArray;
          }
          c = (uint)(ushort)pcVar7[lVar8];
        }
        UVar2 = PatternProps::isWhiteSpace(c);
        if (UVar2 == '\0') break;
        sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
        uVar3 = (uint)sVar1;
        if (sVar1 < 0) {
          uVar5 = (description->fUnion).fFields.fLength;
        }
        else {
          uVar5 = (int)uVar3 >> 5;
        }
        lVar8 = lVar8 + 1;
        srcStart = srcStart + 1;
      } while (lVar8 < (int)uVar5);
    }
    if ((int)srcStart < 0) {
      uVar3 = 0;
    }
    else {
      sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar3 = (description->fUnion).fFields.fLength;
      }
      else {
        uVar3 = (int)sVar1 >> 5;
      }
      if ((int)srcStart <= (int)uVar3) {
        uVar3 = srcStart;
      }
    }
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (description->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    iVar4 = UnicodeString::doIndexOf(description,L';',uVar3,iVar6 - uVar3);
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (description->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    if (iVar4 == -1) {
      UnicodeString::doAppend(&local_70,description,srcStart,iVar6 - srcStart);
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = 0xffffffff;
      if (iVar4 < iVar6) {
        UnicodeString::doAppend(&local_70,description,srcStart,(iVar4 + 1U) - srcStart);
        uVar3 = iVar4 + 1U;
      }
    }
    srcStart = uVar3;
  } while (srcStart != 0xffffffff);
  UnicodeString::copyFrom(description,&local_70,'\0');
  UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void
RuleBasedNumberFormat::stripWhitespace(UnicodeString& description)
{
    // iterate through the characters...
    UnicodeString result;

    int start = 0;
    while (start != -1 && start < description.length()) {
        // seek to the first non-whitespace character...
        while (start < description.length()
            && PatternProps::isWhiteSpace(description.charAt(start))) {
            ++start;
        }

        // locate the next semicolon in the text and copy the text from
        // our current position up to that semicolon into the result
        int32_t p = description.indexOf(gSemiColon, start);
        if (p == -1) {
            // or if we don't find a semicolon, just copy the rest of
            // the string into the result
            result.append(description, start, description.length() - start);
            start = -1;
        }
        else if (p < description.length()) {
            result.append(description, start, p + 1 - start);
            start = p + 1;
        }

        // when we get here, we've seeked off the end of the string, and
        // we terminate the loop (we continue until *start* is -1 rather
        // than until *p* is -1, because otherwise we'd miss the last
        // rule in the description)
        else {
            start = -1;
        }
    }

    description.setTo(result);
}